

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcRootLogLikelihoodsByPartition
          (BeagleCPUImpl<float,_1,_0> *this,int *bufferIndices,int *categoryWeightsIndices,
          int *stateFrequenciesIndices,int *cumulativeScaleIndices,int *partitionIndices,
          int partitionCount,double *outSumLogLikelihoodByPartition)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  double *pdVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int l;
  int iVar21;
  int k_1;
  long lVar22;
  long lVar23;
  int iVar24;
  long lVar25;
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined8 in_XMM2_Qb;
  
  for (uVar17 = 0; uVar17 != (uint)(~(partitionCount >> 0x1f) & partitionCount); uVar17 = uVar17 + 1
      ) {
    uVar11 = this->kStateCount;
    iVar2 = this->kPartialsPaddedStateCount;
    iVar3 = this->gPatternPartitionsStartPatterns[partitionIndices[uVar17]];
    iVar4 = this->gPatternPartitionsStartPatterns[(long)partitionIndices[uVar17] + 1];
    lVar23 = (long)iVar4;
    lVar12 = (long)iVar3;
    pfVar6 = this->gPartials[bufferIndices[uVar17]];
    pfVar7 = this->gCategoryWeights[categoryWeightsIndices[uVar17]];
    uVar5 = cumulativeScaleIndices[uVar17];
    iVar16 = iVar2 * iVar3;
    pfVar8 = this->gStateFrequencies[stateFrequenciesIndices[uVar17]];
    iVar14 = uVar11 * iVar3;
    iVar15 = -(~((int)uVar11 >> 0x1f) & uVar11);
    iVar18 = iVar14;
    for (iVar19 = iVar3; iVar19 < iVar4; iVar19 = iVar19 + 1) {
      lVar22 = 0;
      pfVar9 = this->integrationTmp;
      for (iVar24 = 0; iVar15 != iVar24; iVar24 = iVar24 + -1) {
        *(float *)((long)pfVar9 + lVar22 + (long)iVar18 * 4) =
             *(float *)((long)pfVar6 + lVar22 + (long)iVar16 * 4) * *pfVar7;
        lVar22 = lVar22 + 4;
      }
      iVar16 = iVar16 - iVar24;
      iVar18 = iVar18 - iVar24;
    }
    iVar19 = this->kCategoryCount;
    iVar18 = this->kPatternCount;
    for (lVar22 = 1; lVar25 = lVar12, lVar22 < iVar19; lVar22 = lVar22 + 1) {
      iVar16 = iVar16 + ((iVar3 - iVar4) + iVar18) * iVar2;
      iVar21 = iVar14;
      for (iVar24 = iVar3; iVar24 < iVar4; iVar24 = iVar24 + 1) {
        lVar25 = 0;
        iVar20 = 0;
        pfVar9 = this->integrationTmp;
        while (iVar15 != iVar20) {
          iVar20 = iVar20 + -1;
          auVar27 = vfmadd213ss_fma(ZEXT416((uint)pfVar7[lVar22]),
                                    ZEXT416(*(uint *)((long)pfVar6 + lVar25 + (long)iVar16 * 4)),
                                    ZEXT416(*(uint *)((long)pfVar9 + lVar25 + (long)iVar21 * 4)));
          *(int *)((long)pfVar9 + lVar25 + (long)iVar21 * 4) = auVar27._0_4_;
          lVar25 = lVar25 + 4;
        }
        iVar16 = iVar16 - iVar20;
        iVar21 = iVar21 - iVar20;
      }
    }
    for (; lVar25 < lVar23; lVar25 = lVar25 + 1) {
      auVar27 = ZEXT816(0) << 0x40;
      uVar11 = ~(this->kStateCount >> 0x1f) & this->kStateCount;
      for (uVar13 = 0; uVar11 != uVar13; uVar13 = uVar13 + 1) {
        auVar27 = vfmadd231ss_fma(auVar27,ZEXT416((uint)pfVar8[uVar13]),
                                  ZEXT416((uint)this->integrationTmp[(long)iVar14 + uVar13]));
      }
      iVar14 = iVar14 + uVar11;
      dVar26 = log((double)auVar27._0_4_);
      this->outLogLikelihoodsTmp[lVar25] = (float)dVar26;
    }
    if (-1 < (int)uVar5) {
      pfVar6 = this->outLogLikelihoodsTmp;
      pfVar7 = this->gScaleBuffers[uVar5];
      for (lVar22 = lVar12; lVar22 < lVar23; lVar22 = lVar22 + 1) {
        pfVar6[lVar22] = pfVar7[lVar22] + pfVar6[lVar22];
      }
    }
    auVar27 = ZEXT816(0) << 0x40;
    outSumLogLikelihoodByPartition[uVar17] = 0.0;
    pdVar10 = this->gPatternWeights;
    pfVar6 = this->outLogLikelihoodsTmp;
    for (; lVar12 < lVar23; lVar12 = lVar12 + 1) {
      auVar28._0_8_ = (double)pfVar6[lVar12];
      auVar28._8_8_ = in_XMM2_Qb;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = pdVar10[lVar12];
      auVar27 = vfmadd231sd_fma(auVar27,auVar28,auVar1);
      outSumLogLikelihoodByPartition[uVar17] = auVar27._0_8_;
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcRootLogLikelihoodsByPartition(
                                                         const int* bufferIndices,
                                                         const int* categoryWeightsIndices,
                                                         const int* stateFrequenciesIndices,
                                                         const int* cumulativeScaleIndices,
                                                         const int* partitionIndices,
                                                         int partitionCount,
                                                         double* outSumLogLikelihoodByPartition) {

    for (int p = 0; p < partitionCount; p++) {
        int pIndex = partitionIndices[p];

        int startPattern = gPatternPartitionsStartPatterns[pIndex];
        int endPattern = gPatternPartitionsStartPatterns[pIndex + 1];

        const REALTYPE* rootPartials = gPartials[bufferIndices[p]];
        const REALTYPE* wt = gCategoryWeights[categoryWeightsIndices[p]];
        const REALTYPE* freqs = gStateFrequencies[stateFrequenciesIndices[p]];
        const int scalingFactorsIndex = cumulativeScaleIndices[p];
        int u = startPattern * kStateCount;
        int v = startPattern * kPartialsPaddedStateCount;
        for (int k = startPattern; k < endPattern; k++) {
            for (int i = 0; i < kStateCount; i++) {
                integrationTmp[u] = rootPartials[v] * (REALTYPE) wt[0];
                u++;
                v++;
            }
            v += P_PAD;
        }
        for (int l = 1; l < kCategoryCount; l++) {
            u = startPattern * kStateCount;
            v += ((kPatternCount - endPattern) + startPattern) * kPartialsPaddedStateCount;
            for (int k = startPattern; k < endPattern; k++) {
                for (int i = 0; i < kStateCount; i++) {
                    integrationTmp[u] += rootPartials[v] * (REALTYPE) wt[l];
                    u++;
                    v++;
                }
                v += P_PAD;
            }
        }
        u = startPattern * kStateCount;
        for (int k = startPattern; k < endPattern; k++) {
            REALTYPE sum = 0.0;
            for (int i = 0; i < kStateCount; i++) {
                sum += freqs[i] * integrationTmp[u];
                u++;
            }

            outLogLikelihoodsTmp[k] = log(sum);
        }

        if (scalingFactorsIndex >= 0) {
            const REALTYPE* cumulativeScaleFactors = gScaleBuffers[scalingFactorsIndex];
            for(int i=startPattern; i<endPattern; i++) {
                outLogLikelihoodsTmp[i] += cumulativeScaleFactors[i];
            }
        }

        outSumLogLikelihoodByPartition[p] = 0.0;
        for (int i = startPattern; i < endPattern; i++) {
            outSumLogLikelihoodByPartition[p] += outLogLikelihoodsTmp[i] * gPatternWeights[i];
        }

    }

}